

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

void tt_cmap12_next(TT_CMap12 cmap)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  FT_ULong FStack_48;
  FT_UInt gindex;
  FT_ULong n;
  FT_ULong char_code;
  FT_ULong start_id;
  FT_ULong end;
  FT_ULong start;
  FT_Byte *p;
  FT_Face face;
  TT_CMap12 cmap_local;
  
  if (cmap->cur_charcode < 0xffffffff) {
    n = cmap->cur_charcode + 1;
    for (FStack_48 = cmap->cur_group; FStack_48 < cmap->num_groups; FStack_48 = FStack_48 + 1) {
      pFVar1 = (cmap->cmap).data;
      uVar2 = (uint)pFVar1[FStack_48 * 0xc + 0x10] << 0x18 |
              (uint)pFVar1[FStack_48 * 0xc + 0x11] << 0x10 |
              (uint)pFVar1[FStack_48 * 0xc + 0x12] << 8 | (uint)pFVar1[FStack_48 * 0xc + 0x13];
      uVar5 = (ulong)uVar2;
      uVar3 = (uint)pFVar1[FStack_48 * 0xc + 0x18] << 0x18 |
              (uint)pFVar1[FStack_48 * 0xc + 0x19] << 0x10 |
              (uint)pFVar1[FStack_48 * 0xc + 0x1a] << 8 | (uint)pFVar1[FStack_48 * 0xc + 0x1b];
      if (n < uVar5) {
        n = uVar5;
      }
      while( true ) {
        if ((((uint)pFVar1[FStack_48 * 0xc + 0x14] << 0x18 |
              (uint)pFVar1[FStack_48 * 0xc + 0x15] << 0x10 |
              (uint)pFVar1[FStack_48 * 0xc + 0x16] << 8 | (uint)pFVar1[FStack_48 * 0xc + 0x17]) < n)
           || (0xffffffff - (n - uVar5) < (ulong)uVar3)) goto LAB_001990da;
        uVar4 = uVar3 + ((int)n - uVar2);
        if (uVar4 != 0) break;
        if (0xfffffffe < n) goto LAB_001990ed;
        n = n + 1;
      }
      if (uVar4 < (uint)((cmap->cmap).cmap.charmap.face)->num_glyphs) {
        cmap->cur_charcode = n;
        cmap->cur_gindex = uVar4;
        cmap->cur_group = FStack_48;
        return;
      }
LAB_001990da:
    }
  }
LAB_001990ed:
  cmap->valid = '\0';
  return;
}

Assistant:

static void
  tt_cmap12_next( TT_CMap12  cmap )
  {
    FT_Face   face = cmap->cmap.cmap.charmap.face;
    FT_Byte*  p;
    FT_ULong  start, end, start_id, char_code;
    FT_ULong  n;
    FT_UInt   gindex;


    if ( cmap->cur_charcode >= 0xFFFFFFFFUL )
      goto Fail;

    char_code = cmap->cur_charcode + 1;

    for ( n = cmap->cur_group; n < cmap->num_groups; n++ )
    {
      p        = cmap->cmap.data + 16 + 12 * n;
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_PEEK_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            goto Fail;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        cmap->cur_charcode = char_code;
        cmap->cur_gindex   = gindex;
        cmap->cur_group    = n;

        return;
      }
    }

  Fail:
    cmap->valid = 0;
  }